

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O3

void gost_dec_cfb(gost_ctx *ctx,byte *iv,byte *cipher,byte *clear,int blocks)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  byte cur_iv [8];
  byte gamma [8];
  undefined8 local_40;
  byte local_38 [8];
  
  local_40 = *(undefined8 *)iv;
  if (0 < blocks) {
    iVar3 = 0;
    do {
      gostcrypt(ctx,(byte *)&local_40,local_38);
      lVar2 = 0;
      do {
        bVar1 = cipher[lVar2];
        local_38[lVar2 + -8] = bVar1;
        clear[lVar2] = bVar1 ^ local_38[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 8);
      iVar3 = iVar3 + 1;
      cipher = cipher + 8;
      clear = clear + 8;
    } while (iVar3 != blocks);
  }
  return;
}

Assistant:

void gost_dec_cfb(gost_ctx * ctx, const byte * iv, const byte * cipher,
                  byte * clear, int blocks)
{
    byte cur_iv[8];
    byte gamma[8];
    int i, j;
    const byte *in;
    byte *out;
    memcpy(cur_iv, iv, 8);
    for (i = 0, in = cipher, out = clear; i < blocks; i++, in += 8, out += 8) {
        gostcrypt(ctx, cur_iv, gamma);
        for (j = 0; j < 8; j++) {
            out[j] = (cur_iv[j] = in[j]) ^ gamma[j];
        }
    }
}